

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O0

string * __thiscall
libtorrent::read_piece_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,read_piece_alert *this)

{
  bool bVar1;
  uint uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  allocator<char> local_159;
  string local_158;
  string local_138;
  string local_108;
  char local_e8 [8];
  char msg [200];
  read_piece_alert *this_local;
  
  bVar1 = boost::system::error_code::operator_cast_to_bool(&this->error);
  if (bVar1) {
    torrent_alert::message_abi_cxx11_(&local_108,&this->super_torrent_alert);
    uVar4 = ::std::__cxx11::string::c_str();
    uVar2 = libtorrent::aux::strong_typedef::operator_cast_to_int((strong_typedef *)&this->piece);
    boost::system::error_code::message_abi_cxx11_(&local_138,&this->error);
    uVar3 = ::std::__cxx11::string::c_str();
    snprintf(local_e8,200,"%s: read_piece %d failed: %s",uVar4,(ulong)uVar2,uVar3);
    ::std::__cxx11::string::~string((string *)&local_138);
    ::std::__cxx11::string::~string((string *)&local_108);
  }
  else {
    torrent_alert::message_abi_cxx11_(&local_158,&this->super_torrent_alert);
    uVar4 = ::std::__cxx11::string::c_str();
    uVar2 = libtorrent::aux::strong_typedef::operator_cast_to_int((strong_typedef *)&this->piece);
    snprintf(local_e8,200,"%s: read_piece %d successful",uVar4,(ulong)uVar2);
    ::std::__cxx11::string::~string((string *)&local_158);
  }
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,local_e8,&local_159);
  ::std::allocator<char>::~allocator(&local_159);
  return __return_storage_ptr__;
}

Assistant:

std::string read_piece_alert::message() const
	{
#ifdef TORRENT_DISABLE_ALERT_MSG
		return {};
#else
		char msg[200];
		if (error)
		{
			std::snprintf(msg, sizeof(msg), "%s: read_piece %d failed: %s"
				, torrent_alert::message().c_str() , static_cast<int>(piece)
				, error.message().c_str());
		}
		else
		{
			std::snprintf(msg, sizeof(msg), "%s: read_piece %d successful"
				, torrent_alert::message().c_str() , static_cast<int>(piece));
		}
		return msg;
#endif
	}